

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O0

boolean piday(void)

{
  int iVar1;
  bool local_a;
  
  iVar1 = getmonth();
  if ((iVar1 == 3) && (iVar1 = getmday(), iVar1 == 0xe)) {
    return '\x01';
  }
  iVar1 = getmday();
  local_a = false;
  if (iVar1 == 0x16) {
    iVar1 = getmonth();
    local_a = iVar1 == 7;
  }
  return local_a;
}

Assistant:

boolean piday(void)
{
	return (boolean)(
		(getmonth() == 3 && getmday() == 14) ||	/* Pi Day */
		(getmday() == 22 && getmonth() == 7));	/* Pi Approximation Day */
}